

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O1

int __thiscall
CVmObjStrComp::getp_match_values
          (CVmObjStrComp *this,vm_obj_id_t param_1,vm_val_t *retval,uint *argc)

{
  int iVar1;
  ushort *puVar2;
  ushort *puVar3;
  
  if (getp_match_values(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_match_values();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_match_values::desc);
  if (iVar1 == 0) {
    puVar2 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -2);
    if ((puVar2 == (ushort *)0x0) || (puVar3 == (ushort *)0x0)) {
      err_throw(0x900);
    }
    iVar1 = (*(this->super_CVmObject)._vptr_CVmObject[0x3c])
                      (this,puVar2 + 1,(ulong)*puVar2,puVar3 + 1,(ulong)*puVar3);
    retval->typ = VM_INT;
    (retval->val).intval = iVar1;
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjStrComp::getp_match_values(VMG_ vm_obj_id_t /*self*/,
                                     vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(2);
    const char *valstr;
    const char *refstr;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the strings, but leave them on the stack for gc protection */
    valstr = G_stk->get(0)->get_as_string(vmg0_);
    refstr = G_stk->get(1)->get_as_string(vmg0_);

    /* make sure they're valid strings */
    if (valstr == 0 || refstr == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* compare the strings and return the result */
    retval->set_int(match_strings(valstr + VMB_LEN, vmb_get_len(valstr),
                                  refstr + VMB_LEN, vmb_get_len(refstr)));

    /* discard the gc protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}